

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

BinaryOperator * __thiscall
soul::PoolAllocator::
allocate<soul::heart::BinaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
          (PoolAllocator *this,CodeLocation *args,Expression *args_1,Expression *args_2,Op *args_3)

{
  PoolItem *pPVar1;
  CodeLocation local_38;
  
  pPVar1 = allocateSpaceForObject(this,0x48);
  local_38.sourceCode.object = (args->sourceCode).object;
  local_38.location.data = (args->location).data;
  (args->sourceCode).object = (SourceCodeText *)0x0;
  heart::BinaryOperator::BinaryOperator
            ((BinaryOperator *)&pPVar1->item,&local_38,args_1,args_2,*args_3);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_38.sourceCode);
  pPVar1->destructor =
       allocate<soul::heart::BinaryOperator,_soul::CodeLocation,_soul::heart::Expression_&,_soul::heart::Expression_&,_soul::BinaryOp::Op_&>
       ::anon_class_1_0_00000001::__invoke;
  return (BinaryOperator *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }